

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O1

map<int,_njoy::ENDFtk::section::Type<23>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<23>_>_>_>
* __thiscall
njoy::ENDFtk::file::Base<njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::section::Type<23>>::
read<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (map<int,_njoy::ENDFtk::section::Type<23>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<23>_>_>_>
           *__return_storage_ptr__,
          Base<njoy::ENDFtk::file::Type<23>,njoy::ENDFtk::section::Type<23>> *this,
          StructureDivision *division,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber)

{
  bool bVar1;
  vector<njoy::ENDFtk::section::Type<23>,_std::allocator<njoy::ENDFtk::section::Type<23>_>_>
  sections;
  vector<njoy::ENDFtk::section::Type<23>,_std::allocator<njoy::ENDFtk::section::Type<23>_>_>
  local_f8;
  Type<23> local_d8;
  
  local_f8.
  super__Vector_base<njoy::ENDFtk::section::Type<23>,_std::allocator<njoy::ENDFtk::section::Type<23>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<njoy::ENDFtk::section::Type<23>,_std::allocator<njoy::ENDFtk::section::Type<23>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<njoy::ENDFtk::section::Type<23>,_std::allocator<njoy::ENDFtk::section::Type<23>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    bVar1 = StructureDivision::isSendPermissive((StructureDivision *)this);
    if ((bVar1 && *(int *)(this + 0x34) == 0) && (0 < *(int *)(this + 0x30))) break;
    ENDFtk::section::Type<23>::Type<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (&local_d8,(HEAD *)this,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)division,begin,(long *)end,*(int *)(this + 0x30));
    std::vector<njoy::ENDFtk::section::Type<23>,std::allocator<njoy::ENDFtk::section::Type<23>>>::
    emplace_back<njoy::ENDFtk::section::Type<23>>
              ((vector<njoy::ENDFtk::section::Type<23>,std::allocator<njoy::ENDFtk::section::Type<23>>>
                *)&local_f8,&local_d8);
    if (local_d8.table.yValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.table.yValues.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_d8.table.yValues.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.table.yValues.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_d8.table.xValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.table.xValues.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_d8.table.xValues.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.table.xValues.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_d8.table.super_InterpolationBase.interpolationSchemeIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
        (pointer)0x0) {
      operator_delete(local_d8.table.super_InterpolationBase.interpolationSchemeIndices.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d8.table.super_InterpolationBase.interpolationSchemeIndices.
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.table.super_InterpolationBase.interpolationSchemeIndices.
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_d8.table.super_InterpolationBase.boundaryIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
        (pointer)0x0) {
      operator_delete(local_d8.table.super_InterpolationBase.boundaryIndices.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d8.table.super_InterpolationBase.boundaryIndices.
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.table.super_InterpolationBase.boundaryIndices.
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    StructureDivision::StructureDivision<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((StructureDivision *)&local_d8,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )*(char **)&(division->base).fields.
                            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                            super__Tuple_impl<2UL,_long,_long,_long,_long>.
                            super__Tuple_impl<3UL,_long,_long,_long>.
                            super__Tuple_impl<4UL,_long,_long>,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)division,begin,(long *)end);
    *(long *)(this + 0x20) =
         local_d8.table.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
    *(long *)(this + 0x28) =
         local_d8.table.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Head_base<3UL,_long,_false>._M_head_impl;
    *(undefined8 *)(this + 0x10) = local_d8.super_Base._16_8_;
    *(_Head_base<5UL,_long,_false> *)(this + 0x18) =
         local_d8.table.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
         super__Head_base<5UL,_long,_false>._M_head_impl;
    *(undefined8 *)this = local_d8.super_Base.super_BaseWithoutMT<njoy::ENDFtk::section::Base>._0_8_
    ;
    *(double *)(this + 8) =
         local_d8.super_Base.super_BaseWithoutMT<njoy::ENDFtk::section::Base>.atomicWeightRatio_;
    *(undefined4 *)(this + 0x38) =
         local_d8.table.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>
         ._M_head_impl._0_4_;
    *(long *)(this + 0x30) =
         local_d8.table.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
         _M_head_impl;
  }
  Base<njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::section::Type<23>_>::verifyFEND
            ((StructureDivision *)this,(long)end->_M_current);
  Base<njoy::ENDFtk::file::Type<23>,_njoy::ENDFtk::section::Type<23>_>::fill
            (__return_storage_ptr__,&local_f8);
  std::vector<njoy::ENDFtk::section::Type<23>,_std::allocator<njoy::ENDFtk::section::Type<23>_>_>::
  ~vector(&local_f8);
  return __return_storage_ptr__;
}

Assistant:

static auto
read( StructureDivision& division,
      Iterator& begin,
      const Iterator& end,
      long& lineNumber ) {

  std::vector< Section > sections;
  while ( not division.isFend() ) {

    sections.emplace_back( Derived::readSection( division, begin, end, lineNumber ) );
    division = StructureDivision( begin, end, lineNumber );
  }
  verifyFEND( division, lineNumber );
  return fill( std::move( sections ) );
}